

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

cmNinjaRule * __thiscall
anon_unknown.dwarf_17d8b3c::GetScanRule
          (cmNinjaRule *__return_storage_ptr__,anon_unknown_dwarf_17d8b3c *this,string *ruleName,
          string *ppFileName,string *deptype,RuleVariables *vars,string *responseFlag,string *flags,
          cmRulePlaceholderExpander *rulePlaceholderExpander,cmLocalNinjaGenerator *generator,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *scanCmds,string *outputConfig)

{
  undefined1 *puVar1;
  char *__s;
  pointer pcVar2;
  string *psVar3;
  cmNinjaRule *extraout_RAX;
  cmNinjaRule *pcVar4;
  char *pcVar5;
  cmOutputConverter *outputConverter;
  string *scanCmd;
  string *s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  cmNinjaRule *local_2d8;
  size_type local_2d0;
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  string local_288;
  string local_268;
  string local_248;
  _Alloc_hider local_228;
  undefined1 *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  bool *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  bool local_1a8 [32];
  RuleVariables local_188;
  
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,this,this + (long)&ruleName->_M_dataplus);
  cmNinjaRule::cmNinjaRule(__return_storage_ptr__,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((deptype->_M_string_length == 4) && (*(int *)(deptype->_M_dataplus)._M_p == 0x6376736d)) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->DepType);
    pcVar5 = "";
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->DepType,0,
               (char *)(__return_storage_ptr__->DepType)._M_string_length,0x7bdff9);
    pcVar5 = "$DEP_FILE";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->DepFile,0,
             (char *)(__return_storage_ptr__->DepFile)._M_string_length,(ulong)pcVar5);
  memset(&local_188.TargetPDB,0,0x140);
  local_188.CMTargetName._0_4_ = *(undefined4 *)&vars->CMTargetName;
  local_188.CMTargetName._4_4_ = *(undefined4 *)((long)&vars->CMTargetName + 4);
  local_188.CMTargetType._0_4_ = *(undefined4 *)&vars->CMTargetType;
  local_188.CMTargetType._4_4_ = *(undefined4 *)((long)&vars->CMTargetType + 4);
  local_188.Language = vars->Language;
  local_188.Object = "$OBJ_FILE";
  local_188.PreprocessedSource = (ppFileName->_M_dataplus)._M_p;
  local_188.DynDepFile = "$DYNDEP_INTERMEDIATE_FILE";
  local_188.DependencyFile = (__return_storage_ptr__->DepFile)._M_dataplus._M_p;
  local_188.DependencyTarget = "$out";
  local_188.Source = vars->Source;
  pcVar5 = vars->Defines;
  __s = vars->Includes;
  local_2d8 = (cmNinjaRule *)local_2c8;
  pcVar2 = (flags->_M_dataplus)._M_p;
  local_188.Defines = pcVar5;
  local_188.Includes = __s;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,pcVar2,pcVar2 + flags->_M_string_length);
  if (responseFlag->_M_string_length != 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->RspFile,0,
               (char *)(__return_storage_ptr__->RspFile)._M_string_length,0x77fcf1);
    local_1e8._M_p = (pointer)0x1;
    local_1d8[0]._M_local_buf[0] = ' ';
    local_1e0 = local_1d8;
    local_248.field_2._M_allocated_capacity = strlen(pcVar5);
    local_248._M_dataplus._M_p = (pointer)0x1;
    puVar1 = local_2c8 + 0x20;
    local_2b8._M_allocated_capacity = 1;
    local_2a8 = 0x20;
    local_228._M_p = (pointer)0x1;
    local_2b8._8_8_ = puVar1;
    local_248._M_string_length = (size_type)local_1d8;
    local_248.field_2._8_8_ = pcVar5;
    local_220 = puVar1;
    local_218._M_allocated_capacity = strlen(__s);
    local_200 = local_1a8;
    local_1b8._M_allocated_capacity = 1;
    local_1a8[0] = true;
    local_208._M_p = (pointer)0x1;
    local_1f8._M_allocated_capacity = local_2d0;
    local_1f8._8_8_ = local_2d8;
    views._M_len = 6;
    views._M_array = (iterator)&local_248;
    local_218._8_8_ = __s;
    local_1b8._8_8_ = local_200;
    cmCatViews_abi_cxx11_(&local_288,views);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->RspContent,(string *)&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    local_248._M_string_length = (size_type)(responseFlag->_M_dataplus)._M_p;
    local_248._M_dataplus._M_p = (pointer)responseFlag->_M_string_length;
    local_248.field_2._8_8_ = (__return_storage_ptr__->RspFile)._M_dataplus._M_p;
    local_248.field_2._M_allocated_capacity = (__return_storage_ptr__->RspFile)._M_string_length;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_248;
    cmCatViews_abi_cxx11_((string *)(local_2c8 + 0x10),views_00);
    std::__cxx11::string::operator=((string *)&local_2d8,(string *)(local_2c8 + 0x10));
    if ((undefined1 *)local_2b8._M_allocated_capacity != puVar1) {
      operator_delete((void *)local_2b8._M_allocated_capacity,CONCAT71(uStack_2a7,local_2a8) + 1);
    }
    local_188.Defines = "";
    local_188.Includes = "";
  }
  local_188.Flags = (char *)local_2d8;
  s = (scanCmds->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (scanCmds->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (s != psVar3) {
    outputConverter =
         &(generator->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
    if (generator == (cmLocalNinjaGenerator *)0x0) {
      outputConverter = (cmOutputConverter *)0x0;
    }
    do {
      cmRulePlaceholderExpander::ExpandRuleVariables
                (rulePlaceholderExpander,outputConverter,s,&local_188);
      s = s + 1;
    } while (s != psVar3);
  }
  local_2b8._8_8_ = 0;
  local_2a8 = 0;
  local_2b8._M_allocated_capacity = (size_type)(local_2c8 + 0x20);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_248,generator,scanCmds,outputConfig,outputConfig,(string *)(local_2c8 + 0x10),
             (cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Command,(string *)&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2b8._M_allocated_capacity != local_2c8 + 0x20) {
    operator_delete((void *)local_2b8._M_allocated_capacity,CONCAT71(uStack_2a7,local_2a8) + 1);
  }
  pcVar4 = (cmNinjaRule *)local_2c8;
  if (local_2d8 != pcVar4) {
    operator_delete(local_2d8,(ulong)(local_2c8._0_8_ + 1));
    pcVar4 = extraout_RAX;
  }
  return pcVar4;
}

Assistant:

cmNinjaRule GetScanRule(
  std::string const& ruleName, std::string const& ppFileName,
  std::string const& deptype,
  cmRulePlaceholderExpander::RuleVariables const& vars,
  const std::string& responseFlag, const std::string& flags,
  cmRulePlaceholderExpander* const rulePlaceholderExpander,
  cmLocalNinjaGenerator* generator, std::vector<std::string> scanCmds,
  const std::string& outputConfig)
{
  cmNinjaRule rule(ruleName);
  // Scanning always uses a depfile for preprocessor dependencies.
  if (deptype == "msvc"_s) {
    rule.DepType = deptype;
    rule.DepFile = "";
  } else {
    rule.DepType = ""; // no deps= for multiple outputs
    rule.DepFile = "$DEP_FILE";
  }

  cmRulePlaceholderExpander::RuleVariables scanVars;
  scanVars.CMTargetName = vars.CMTargetName;
  scanVars.CMTargetType = vars.CMTargetType;
  scanVars.Language = vars.Language;
  scanVars.Object = "$OBJ_FILE";
  scanVars.PreprocessedSource = ppFileName.c_str();
  scanVars.DynDepFile = "$DYNDEP_INTERMEDIATE_FILE";
  scanVars.DependencyFile = rule.DepFile.c_str();
  scanVars.DependencyTarget = "$out";

  // Scanning needs the same preprocessor settings as direct compilation would.
  scanVars.Source = vars.Source;
  scanVars.Defines = vars.Defines;
  scanVars.Includes = vars.Includes;

  // Scanning needs the compilation flags too.
  std::string scanFlags = flags;

  // If using a response file, move defines, includes, and flags into it.
  if (!responseFlag.empty()) {
    rule.RspFile = "$RSP_FILE";
    rule.RspContent =
      cmStrCat(' ', scanVars.Defines, ' ', scanVars.Includes, ' ', scanFlags);
    scanFlags = cmStrCat(responseFlag, rule.RspFile);
    scanVars.Defines = "";
    scanVars.Includes = "";
  }

  scanVars.Flags = scanFlags.c_str();

  // Rule for scanning a source file.
  for (std::string& scanCmd : scanCmds) {
    rulePlaceholderExpander->ExpandRuleVariables(generator, scanCmd, scanVars);
  }
  rule.Command =
    generator->BuildCommandLine(scanCmds, outputConfig, outputConfig);

  return rule;
}